

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O0

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,IfThenConstraint *c,
          PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>_>
          *prepro)

{
  Type t;
  double *pdVar1;
  const_reference pvVar2;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDX;
  long in_RSI;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDI;
  Arguments *args;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  double l;
  value_type vVar3;
  _Base_ptr local_40;
  _Base_ptr local_38;
  _Base_ptr local_30;
  double local_28;
  _Head_base<0UL,_mp::BasicFileAppender_*,_false> local_20;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *local_18;
  
  local_18 = in_RDX;
  local_20._M_head_impl =
       (BasicFileAppender *)
       CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::IfThenId>::GetArguments
                 ((CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::IfThenId> *)
                  (in_RSI + 0x28));
  this_00 = local_18;
  std::array<int,_3UL>::operator[]
            ((array<int,_3UL> *)local_18,
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_28 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::lb(this_00,in_stack_ffffffffffffff7c);
  std::array<int,_3UL>::operator[]
            ((array<int,_3UL> *)this_00,
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_30 = (_Base_ptr)
             FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::lb(this_00,in_stack_ffffffffffffff7c);
  pdVar1 = std::min<double>(&stack0xffffffffffffffd8,(double *)&stack0xffffffffffffffd0);
  l = *pdVar1;
  std::array<int,_3UL>::operator[]
            ((array<int,_3UL> *)this_00,
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_38 = (_Base_ptr)
             FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::ub(this_00,in_stack_ffffffffffffff7c);
  std::array<int,_3UL>::operator[]
            ((array<int,_3UL> *)this_00,
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_40 = (_Base_ptr)
             FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::ub(this_00,in_stack_ffffffffffffff7c);
  std::max<double>((double *)&stack0xffffffffffffffc8,(double *)&stack0xffffffffffffffc0);
  PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>_>
  ::narrow_result_bounds
            ((PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>_>
              *)in_RDI,l,(double)this_00);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::GetModel(in_RDI);
  pvVar2 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)this_00,
                      CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  vVar3 = *pvVar2;
  pvVar2 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)this_00,
                      CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  t = FlatModel<mp::DefaultFlatModelParams>::common_type<std::initializer_list<int>>
                ((FlatModel<mp::DefaultFlatModelParams> *)&stack0xffffffffffffffa8,
                 (initializer_list<int> *)CONCAT44(*pvVar2,vVar3));
  PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>_>
  ::set_result_type((PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>_>
                     *)local_18,t);
  return;
}

Assistant:

void PreprocessConstraint(
      IfThenConstraint& c, PreprocessInfo& prepro) {
    const auto& args = c.GetArguments();
    prepro.narrow_result_bounds(
          std::min(MPD( lb(args[1]) ), MPD( lb(args[2]) )),
        std::max(MPD( ub(args[1]) ), MPD( ub(args[2]) )));
    prepro.set_result_type( MP_DISPATCH(GetModel()).
                            common_type( { args[1], args[2] } ) );
  }